

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar_p.h
# Opt level: O2

void __thiscall QTabBarPrivate::makeVisible(QTabBarPrivate *this,int index)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  QWidget *this_00;
  Tab **ppTVar5;
  Tab *pTVar6;
  QWidgetData *pQVar7;
  Representation RVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  QRect *pQVar13;
  int iVar14;
  int iVar15;
  Representation *pRVar16;
  long lVar17;
  QRect *pQVar18;
  Representation RVar19;
  QRect QVar20;
  QRect QVar21;
  
  if (index < 0) {
    return;
  }
  uVar4 = (this->tabList).d.size;
  if (uVar4 <= (uint)index) {
    return;
  }
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  ppTVar5 = (this->tabList).d.ptr;
  pTVar6 = ppTVar5[(uint)index];
  pQVar7 = this_00->data;
  if ((this->shape - RoundedWest & 0xfffffffa) == 0) {
    pQVar13 = (QRect *)&(pTVar6->rect).y1;
    pRVar16 = &(pQVar7->crect).y2;
    pQVar18 = (QRect *)&(pQVar7->crect).y1;
    lVar17 = 0x74;
  }
  else {
    pQVar13 = &pTVar6->rect;
    pQVar18 = &pQVar7->crect;
    pRVar16 = &(pQVar7->crect).x2;
    lVar17 = 0x70;
  }
  iVar1 = this->scrollOffset;
  iVar12 = pRVar16->m_i;
  iVar10 = (pQVar18->x1).m_i;
  iVar2 = *(int *)((long)&(ppTVar5[uVar4 - 1]->text).d.d + lVar17);
  iVar3 = (pQVar13->x1).m_i;
  iVar15 = *(int *)((long)&(pTVar6->text).d.d + lVar17);
  QVar20 = normalizedScrollRect(this,index);
  QVar21 = normalizedScrollRect(this,0);
  iVar11 = this->scrollOffset;
  RVar8 = QVar20.x2.m_i;
  iVar9 = iVar11 + RVar8.m_i;
  if (iVar2 + -1 < iVar11 + RVar8.m_i) {
    iVar9 = iVar2 + -1;
  }
  RVar19 = QVar20.x1.m_i;
  iVar14 = 0;
  if ((iVar12 - iVar10) + 1 < iVar2) {
    iVar12 = 1;
    if (1 < iVar11 + RVar19.m_i) {
      iVar12 = iVar11 + RVar19.m_i;
    }
    if (iVar3 < iVar12) {
      iVar14 = iVar3 - RVar19.m_i;
    }
    else if (iVar9 < iVar15) {
      iVar15 = iVar15 - RVar8.m_i;
      iVar14 = 0;
      if (0 < iVar15) {
        iVar14 = iVar15;
      }
    }
    else {
      iVar12 = QVar21.x2.m_i.m_i - QVar21.x1.m_i;
      if (iVar12 + iVar11 + 1 <= iVar2 + 1) goto LAB_0044e47a;
      iVar10 = iVar2 - (iVar12 + 1);
      iVar12 = -1;
      if (-1 < iVar10) {
        iVar12 = iVar10;
      }
      iVar14 = iVar12 + 1;
    }
  }
  this->scrollOffset = iVar14;
  iVar11 = iVar14;
LAB_0044e47a:
  QWidget::setEnabled((QWidget *)this->leftB,
                      iVar11 != -RVar19.m_i &&
                      SBORROW4(iVar11,-RVar19.m_i) == iVar11 + RVar19.m_i < 0);
  QWidget::setEnabled((QWidget *)this->rightB,this->scrollOffset < iVar2 - RVar8.m_i);
  if (iVar1 == this->scrollOffset) {
    return;
  }
  QWidget::update(this_00);
  layoutWidgets(this,0);
  return;
}

Assistant:

inline bool validIndex(int index) const { return index >= 0 && index < tabList.size(); }